

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

bool rsg::TanOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  bool bVar2;
  
  bVar2 = outMin <= 4.0 && -4.0 <= outMax;
  if (bVar2) {
    if (outMin <= -4.0) {
      outMin = -4.0;
    }
    fVar1 = atanf(outMin);
    *inMin = fVar1;
    if (4.0 <= outMax) {
      outMax = 4.0;
    }
    fVar1 = atanf(outMax);
    *inMax = fVar1;
  }
  return bVar2;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// \note Currently tan() is limited to -4..4 range. Otherwise we will run into accuracy issues
		const float rangeMin = -4.0f;
		const float rangeMax = +4.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false;

		inMin = deFloatAtanOver(deFloatMax(outMin, rangeMin));
		inMax = deFloatAtanOver(deFloatMin(outMax, rangeMax));

		return true;
	}